

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_dr_flac * ma_dr_flac_open_file(char *pFileName,ma_allocation_callbacks *pAllocationCallbacks)

{
  ma_result mVar1;
  ma_dr_flac *pmVar2;
  FILE *pFile;
  FILE *local_10;
  
  mVar1 = ma_fopen((FILE **)&local_10,pFileName,"rb");
  if (mVar1 == MA_SUCCESS) {
    pmVar2 = ma_dr_flac_open_with_metadata_private
                       (ma_dr_flac__on_read_stdio,ma_dr_flac__on_seek_stdio,
                        (ma_dr_flac_meta_proc)0x0,ma_dr_flac_container_unknown,local_10,local_10,
                        pAllocationCallbacks);
    if (pmVar2 != (ma_dr_flac *)0x0) {
      return pmVar2;
    }
    fclose(local_10);
  }
  return (ma_dr_flac *)0x0;
}

Assistant:

MA_API ma_dr_flac* ma_dr_flac_open_file(const char* pFileName, const ma_allocation_callbacks* pAllocationCallbacks)
{
    ma_dr_flac* pFlac;
    FILE* pFile;
    if (ma_fopen(&pFile, pFileName, "rb") != MA_SUCCESS) {
        return NULL;
    }
    pFlac = ma_dr_flac_open(ma_dr_flac__on_read_stdio, ma_dr_flac__on_seek_stdio, (void*)pFile, pAllocationCallbacks);
    if (pFlac == NULL) {
        fclose(pFile);
        return NULL;
    }
    return pFlac;
}